

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O0

bool __thiscall sjtu::UserManager::is_login(UserManager *this,string *username)

{
  long lVar1;
  byte bVar2;
  string *in_RSI;
  long in_RDI;
  pair<long,_bool> pVar3;
  userType *cur;
  pair<long,_bool> tmp;
  string *in_stack_ffffffffffffff88;
  StringHasher *in_stack_ffffffffffffff90;
  string local_50 [32];
  hashType local_30;
  unsigned_long_long *in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  bool local_1;
  
  std::__cxx11::string::string(local_50,in_RSI);
  local_30 = StringHasher::operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pVar3 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    ((BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *)
                     CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
  bVar2 = pVar3.second;
  std::__cxx11::string::~string(local_50);
  if ((bVar2 & 1) == 0) {
    local_1 = false;
  }
  else {
    lVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))
                      (*(long **)(in_RDI + 0x10),&stack0xffffffffffffffd8);
    local_1 = *(int *)(lVar1 + 0x6c) == *(int *)(in_RDI + 0x18);
  }
  return local_1;
}

Assistant:

bool is_login(std::string username) {
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(username));
            if (tmp.second == false) return false;
            else {
                userType *cur = UserFile->read(tmp.first);
                return cur->is_online == online_flag;
            }
        }